

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bpattern(bstring b,int len)

{
  int iVar1;
  int local_28;
  int local_20;
  int d;
  int i;
  int len_local;
  bstring b_local;
  
  if ((b == (bstring)0x0) || (b->slen < 0)) {
    local_28 = 0;
  }
  else {
    local_28 = b->slen;
  }
  if (((local_28 < 1) || (len < 0)) || (iVar1 = balloc(b,len + 1), iVar1 != 0)) {
    b_local._4_4_ = -1;
  }
  else {
    if (0 < len) {
      if (local_28 == 1) {
        iVar1 = bsetstr(b,len,(bstring)0x0,*b->data);
        return iVar1;
      }
      for (local_20 = local_28; local_20 < len; local_20 = local_20 + 1) {
        b->data[local_20] = b->data[local_20 - local_28];
      }
    }
    b->data[len] = '\0';
    b->slen = len;
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int bpattern (bstring b, int len) {
int i, d;

	d = blength (b);
	if (d <= 0 || len < 0 || balloc (b, len + 1) != BSTR_OK) return BSTR_ERR;
	if (len > 0) {
		if (d == 1) return bsetstr (b, len, NULL, b->data[0]);
		for (i = d; i < len; i++) b->data[i] = b->data[i - d];
	}
	b->data[len] = (unsigned char) '\0';
	b->slen = len;
	return 0;
}